

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack_encoder.hpp
# Opt level: O1

bool __thiscall
jsoncons::msgpack::basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::
visit_byte_string(basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,
                 byte_string_view *b,semantic_tag param_2,ser_context *param_3,error_code *param_4)

{
  size_t *psVar1;
  ulong uVar2;
  size_t sVar3;
  uint8_t *puVar4;
  pointer psVar5;
  uint uVar6;
  long lVar7;
  size_t sVar8;
  uint8_t buf_1 [2];
  uint8_t buf [4];
  ushort local_2e;
  uint local_2c;
  
  uVar2 = b->size_;
  if (uVar2 < 0x100) {
    binary_stream_sink::push_back(&this->sink_,0xc4);
    binary_stream_sink::push_back(&this->sink_,(uint8_t)uVar2);
  }
  else if (uVar2 < 0x10000) {
    binary_stream_sink::push_back(&this->sink_,0xc5);
    local_2e = (ushort)uVar2 << 8 | (ushort)uVar2 >> 8;
    lVar7 = 0;
    do {
      binary_stream_sink::push_back(&this->sink_,*(uint8_t *)((long)&local_2e + lVar7));
      lVar7 = lVar7 + 1;
    } while (lVar7 != 2);
  }
  else if (uVar2 >> 0x20 == 0) {
    binary_stream_sink::push_back(&this->sink_,0xc6);
    uVar6 = (uint)uVar2;
    local_2c = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
    lVar7 = 0;
    do {
      binary_stream_sink::push_back(&this->sink_,*(uint8_t *)((long)&local_2c + lVar7));
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
  }
  sVar3 = b->size_;
  if (sVar3 != 0) {
    puVar4 = b->data_;
    sVar8 = 0;
    do {
      binary_stream_sink::push_back(&this->sink_,puVar4[sVar8]);
      sVar8 = sVar8 + 1;
    } while (sVar3 != sVar8);
  }
  psVar5 = (this->stack_).
           super__Vector_base<jsoncons::msgpack::basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::msgpack::basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->stack_).
      super__Vector_base<jsoncons::msgpack::basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::msgpack::basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
      ._M_impl.super__Vector_impl_data._M_start != psVar5) {
    psVar1 = &psVar5[-1].index_;
    *psVar1 = *psVar1 + 1;
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_byte_string(const byte_string_view& b, 
            semantic_tag, 
            const ser_context&,
            std::error_code&) final
        {

            const std::size_t length = b.size();
            if (length <= (std::numeric_limits<uint8_t>::max)())
            {
                // bin 8 stores a byte array whose length is upto (2^8)-1 bytes
                sink_.push_back(jsoncons::msgpack::msgpack_type::bin8_type);
                sink_.push_back(static_cast<uint8_t>(length));
            }
            else if (length <= (std::numeric_limits<uint16_t>::max)())
            {
                // bin 16 stores a byte array whose length is upto (2^16)-1 bytes
                sink_.push_back(jsoncons::msgpack::msgpack_type::bin16_type);
                binary::native_to_big(static_cast<uint16_t>(length), std::back_inserter(sink_));
            }
            else if (length <= (std::numeric_limits<uint32_t>::max)())
            {
                // bin 32 stores a byte array whose length is upto (2^32)-1 bytes
                sink_.push_back(jsoncons::msgpack::msgpack_type::bin32_type);
                binary::native_to_big(static_cast<uint32_t>(length),std::back_inserter(sink_));
            }

            for (auto c : b)
            {
                sink_.push_back(c);
            }

            end_value();
            JSONCONS_VISITOR_RETURN;
        }